

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O1

int skipEscapedLineEnds(char *buffer,int buffer_len,int offset,int *lines)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = offset + 1;
  if (iVar3 < buffer_len) {
    while ((lVar4 = (long)offset, buffer[lVar4] == '\\' &&
           ((buffer[iVar3] == '\r' || (buffer[iVar3] == '\n'))))) {
      uVar1 = lVar4 + 2;
      *lines = *lines + 1;
      uVar2 = uVar1;
      if (((int)uVar1 < buffer_len) &&
         ((buffer[lVar4 + 1] == '\r' && (uVar2 = (ulong)(offset + 3), buffer[uVar1] != '\n')))) {
        uVar2 = uVar1 & 0xffffffff;
      }
      offset = (int)uVar2;
      iVar3 = offset + 1;
      if (buffer_len <= iVar3) {
        return offset;
      }
    }
  }
  return offset;
}

Assistant:

static int skipEscapedLineEnds(const char *buffer, int buffer_len, int offset, int *lines)
{
    // Join physical lines to make logical lines, as in the C preprocessor
    while (offset + 1 < buffer_len
           && buffer[offset] == '\\'
           && qmake_endOfLine(buffer[offset + 1])) {
        offset += 2;
        ++*lines;
        if (offset < buffer_len
            && buffer[offset - 1] == '\r'
            && buffer[offset] == '\n') // CRLF
            offset++;
    }
    return offset;
}